

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O2

uint8_t cueify_full_toc_get_track_sub_q_channel_format(cueify_full_toc *t,uint8_t track)

{
  if (((t != (cueify_full_toc *)0x0) && (*(byte *)((long)t + 2) <= track)) &&
     (track <= *(byte *)((long)t + 3))) {
    return *(uint8_t *)((long)t + (ulong)track * 9 + 5);
  }
  return '\0';
}

Assistant:

uint8_t cueify_full_toc_get_track_sub_q_channel_format(cueify_full_toc *t,
						       uint8_t track) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (track >= toc->first_track_number &&
	       track <= toc->last_track_number) {
	return toc->tracks[track].adr;
    } else {
	return 0;
    }
}